

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.2.4.11.h
# Opt level: O0

bool doctest::operator>(double lhs,Approx *rhs)

{
  double in_RDI;
  double in_XMM0_Qa;
  uint7 in_stack_ffffffffffffffe8;
  bool bVar1;
  
  bVar1 = false;
  if (*(double *)((long)in_RDI + 0x10) <= in_XMM0_Qa &&
      in_XMM0_Qa != *(double *)((long)in_RDI + 0x10)) {
    bVar1 = operator!=(in_RDI,(Approx *)(ulong)in_stack_ffffffffffffffe8);
  }
  return bVar1;
}

Assistant:

bool operator>(double lhs, const Approx& rhs) { return lhs > rhs.m_value && lhs != rhs; }